

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

Blob<256> * bitreverse<Blob<256>>(Blob<256> *n,size_t b)

{
  int iVar1;
  ulong in_RDX;
  Blob<256> *in_RSI;
  Blob<256> *in_RDI;
  size_t i;
  Blob<256> *rv;
  Blob<256> *this;
  Blob<256> local_60;
  Blob<256> local_40;
  ulong local_20;
  ulong local_18;
  
  this = in_RDI;
  local_18 = in_RDX;
  Blob<256>::Blob(in_RDI,0);
  local_20 = 0;
  while (local_20 < local_18) {
    Blob<256>::operator<<(this,(int)((ulong)in_RDI >> 0x20));
    iVar1 = Blob<256>::operator&(in_RSI,1);
    iVar1 = Blob<256>::operator|(&local_60,iVar1);
    Blob<256>::Blob(&local_40,iVar1);
    Blob<256>::operator=(in_RDI,&local_40);
    local_20 = local_20 + 1;
    Blob<256>::operator>>=(in_RDI,(int)((ulong)in_RSI >> 0x20));
  }
  return this;
}

Assistant:

hashtype bitreverse(hashtype n, size_t b = sizeof(hashtype) * 8)
{
    assert(b <= std::numeric_limits<hashtype>::digits);
    hashtype rv = 0;
    for (size_t i = 0; i < b; ++i, n >>= 1) {
        rv = (rv << 1) | (n & 0x01);
    }
    return rv;
}